

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginRegistry.cpp
# Opt level: O3

void Rml::PluginRegistry::RegisterPlugin(Plugin *plugin)

{
  iterator iVar1;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  Plugin *in_RDI;
  Plugin *local_18;
  
  local_18 = in_RDI;
  if (plugin_vectors._8_8_ == 0) {
    ControlledLifetimeResource<Rml::PluginVectors>::Initialize
              ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
  }
  uVar5 = (*in_RDI->_vptr_Plugin[2])();
  if ((uVar5 & 1) != 0) {
    if ((plugin_vectors._8_8_ == 0) &&
       (bVar4 = Assert("Resource used before it was initialized, or after it was shut down.",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                       ,0x46), !bVar4)) goto LAB_0024a538;
    uVar3 = plugin_vectors._8_8_;
    iVar1._M_current = *(Plugin ***)(plugin_vectors._8_8_ + 8);
    if (iVar1._M_current == *(Plugin ***)(plugin_vectors._8_8_ + 0x10)) {
      ::std::vector<Rml::Plugin*,std::allocator<Rml::Plugin*>>::
      _M_realloc_insert<Rml::Plugin*const&>
                ((vector<Rml::Plugin*,std::allocator<Rml::Plugin*>> *)plugin_vectors._8_8_,iVar1,
                 &local_18);
    }
    else {
      *iVar1._M_current = in_RDI;
      *(long *)(uVar3 + 8) = *(long *)(uVar3 + 8) + 8;
    }
  }
  if ((uVar5 & 2) != 0) {
    if ((plugin_vectors._8_8_ == 0) &&
       (bVar4 = Assert("Resource used before it was initialized, or after it was shut down.",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                       ,0x46), !bVar4)) goto LAB_0024a538;
    uVar3 = plugin_vectors._8_8_;
    iVar1._M_current = *(Plugin ***)(plugin_vectors._8_8_ + 0x20);
    if (iVar1._M_current == *(Plugin ***)(plugin_vectors._8_8_ + 0x28)) {
      ::std::vector<Rml::Plugin*,std::allocator<Rml::Plugin*>>::
      _M_realloc_insert<Rml::Plugin*const&>
                ((vector<Rml::Plugin*,std::allocator<Rml::Plugin*>> *)(plugin_vectors._8_8_ + 0x18),
                 iVar1,&local_18);
    }
    else {
      *iVar1._M_current = local_18;
      *(long *)(uVar3 + 0x20) = *(long *)(uVar3 + 0x20) + 8;
    }
  }
  if ((uVar5 & 4) != 0) {
    if ((plugin_vectors._8_8_ == 0) &&
       (bVar4 = Assert("Resource used before it was initialized, or after it was shut down.",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                       ,0x46), !bVar4)) {
LAB_0024a538:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    uVar3 = plugin_vectors._8_8_;
    iVar1._M_current = *(Plugin ***)(plugin_vectors._8_8_ + 0x38);
    if (iVar1._M_current == *(Plugin ***)(plugin_vectors._8_8_ + 0x40)) {
      ::std::vector<Rml::Plugin*,std::allocator<Rml::Plugin*>>::
      _M_realloc_insert<Rml::Plugin*const&>
                ((vector<Rml::Plugin*,std::allocator<Rml::Plugin*>> *)(plugin_vectors._8_8_ + 0x30),
                 iVar1,&local_18);
    }
    else {
      *iVar1._M_current = local_18;
      *(long *)(uVar3 + 0x38) = *(long *)(uVar3 + 0x38) + 8;
    }
  }
  return;
}

Assistant:

void PluginRegistry::RegisterPlugin(Plugin* plugin)
{
	EnsurePluginVectorsInitialized();

	int event_classes = plugin->GetEventClasses();

	if (event_classes & Plugin::EVT_BASIC)
		plugin_vectors->basic.push_back(plugin);
	if (event_classes & Plugin::EVT_DOCUMENT)
		plugin_vectors->document.push_back(plugin);
	if (event_classes & Plugin::EVT_ELEMENT)
		plugin_vectors->element.push_back(plugin);
}